

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test::
~SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test
          (SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test *this)

{
  SolitaireEmptyHandTest::~SolitaireEmptyHandTest(&this->super_SolitaireEmptyHandTest);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardFromStockPile) {
    InSequence seq;
    expectSnapshotCreation(*stockPileMock, snapshotMock);
    EXPECT_CALL(*stockPileMock, tryPullOutCard()).WillOnce(Return(oneCard.back()));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardFromStockPile();
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(oneCard));
}